

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::FileDescriptorProto::FileDescriptorProto(FileDescriptorProto *this)

{
  FileDescriptorProto *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__FileDescriptorProto_009c0c08
  ;
  ::std::__cxx11::string::string((string *)&this->name_);
  ::std::__cxx11::string::string((string *)&this->package_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->dependency_);
  std::vector<int,_std::allocator<int>_>::vector(&this->public_dependency_);
  std::vector<int,_std::allocator<int>_>::vector(&this->weak_dependency_);
  std::
  vector<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ::vector(&this->message_type_);
  std::
  vector<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
  ::vector(&this->enum_type_);
  std::
  vector<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ::vector(&this->extension_);
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<12UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

FileDescriptorProto::FileDescriptorProto() = default;